

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# heapmap.cpp
# Opt level: O0

void test2(void)

{
  HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *this;
  LinkedNode *k;
  allocator local_49;
  string local_48 [32];
  void *local_28;
  LinkedNode *local_20;
  LinkedNode *t;
  HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *pHStack_10;
  int id;
  HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
  *p;
  
  pHStack_10 = TinyGC::
               MakeGarbageCollected<HeapMap<LinkedNode,std::__cxx11::string,std::integral_constant<bool,true>,std::integral_constant<bool,true>>>
                         (tg);
  for (t._4_4_ = 0; t._4_4_ < 10; t._4_4_ = t._4_4_ + 1) {
    local_28 = (void *)0x0;
    k = TinyGC::MakeGarbageCollected<LinkedNode,decltype(nullptr),int&>
                  (tg,&local_28,(int *)((long)&t + 4));
    this = pHStack_10;
    local_20 = k;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_48,"122",&local_49);
    HeapMap<LinkedNode,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::integral_constant<bool,_true>,_std::integral_constant<bool,_true>_>
    ::insert(this,k,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_48);
    std::__cxx11::string::~string(local_48);
    std::allocator<char>::~allocator((allocator<char> *)&local_49);
  }
  return;
}

Assistant:

void test2() {
  HeapMap<LinkedNode, std::string> *p =
      MakeGarbageCollected<HeapMap<LinkedNode, std::string>>();
  for (int id = 0; id < 10; id++) {
    auto t = MakeGarbageCollected<LinkedNode>(nullptr, id);
    p->insert(t, "122");
  }
}